

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGeneratorFunction.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::JavascriptAsyncGeneratorFunction>(RecyclableObject *obj)

{
  bool bVar1;
  undefined1 local_12;
  undefined1 local_11;
  RecyclableObject *obj_local;
  
  bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  local_11 = false;
  if (bVar1) {
    bVar1 = VirtualTableInfo<Js::JavascriptAsyncGeneratorFunction>::HasVirtualTable(obj);
    local_12 = true;
    if (!bVar1) {
      local_12 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptAsyncGeneratorFunction>_>::
                 HasVirtualTable(obj);
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool Js::VarIsImpl<JavascriptAsyncGeneratorFunction>(RecyclableObject* obj)
{
    return VarIs<JavascriptFunction>(obj) && (
        VirtualTableInfo<JavascriptAsyncGeneratorFunction>::HasVirtualTable(obj) ||
        VirtualTableInfo<CrossSiteObject<JavascriptAsyncGeneratorFunction>>::HasVirtualTable(obj)
    );
}